

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O1

ScriptWitness * __thiscall
cfd::core::ConfidentialTransaction::SetPeginWitnessStack
          (ScriptWitness *__return_storage_ptr__,ConfidentialTransaction *this,uint32_t tx_in_index,
          uint32_t witness_index,vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *this_00;
  void *pvVar1;
  wally_tx_witness_stack *stack;
  uchar *witness;
  uchar *puVar2;
  pointer pCVar3;
  CfdException *this_01;
  ulong uVar4;
  int ret;
  string function_name;
  int local_78;
  uint32_t local_74;
  undefined1 local_70 [16];
  char local_60 [16];
  undefined1 local_50 [32];
  
  local_74 = witness_index;
  (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[0xb])
            (this,(ulong)tx_in_index,0x6f2,"SetPeginWitnessStack");
  pvVar1 = (this->super_AbstractTransaction).wally_tx_pointer_;
  uVar4 = (ulong)tx_in_index;
  if (uVar4 < *(ulong *)((long)pvVar1 + 0x10)) {
    local_78 = -2;
    local_70._0_8_ = local_60;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,"wally witness is NULL.","");
    stack = *(wally_tx_witness_stack **)(*(long *)((long)pvVar1 + 8) + 200 + uVar4 * 0xd0);
    if (stack != (wally_tx_witness_stack *)0x0) {
      ::std::__cxx11::string::_M_replace((ulong)local_70,0,(char *)local_70._8_8_,0x5e843b);
      witness = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
      puVar2 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (witness == puVar2) {
        local_78 = wally_tx_witness_stack_set(stack,(ulong)local_74,(uchar *)0x0,0);
      }
      else {
        local_78 = wally_tx_witness_stack_set
                             (stack,(ulong)local_74,witness,(long)puVar2 - (long)witness);
      }
    }
    if (local_78 != 0) {
      local_50._0_8_ = "cfdcore_elements_transaction.cpp";
      local_50._8_4_ = 0x70a;
      local_50._16_8_ = "SetPeginWitnessStack";
      logger::log<std::__cxx11::string&,int&>
                ((CfdSourceLocation *)local_50,kCfdLogLevelWarning,"{} NG[{}].",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                 &local_78);
      this_01 = (CfdException *)__cxa_allocate_exception(0x30);
      local_50._0_8_ = local_50 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"witness stack set error.","");
      CfdException::CfdException(this_01,kCfdIllegalStateError,(string *)local_50);
      __cxa_throw(this_01,&CfdException::typeinfo,CfdException::~CfdException);
    }
    if ((char *)local_70._0_8_ != local_60) {
      operator_delete((void *)local_70._0_8_);
    }
  }
  SetElementsTxState(this);
  pCVar3 = (this->vin_).
           super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ByteData::ByteData((ByteData *)local_50,data);
  ScriptWitness::SetWitnessStack(&pCVar3[uVar4].pegin_witness_,local_74,(ByteData *)local_50);
  this_00 = (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)(local_70 + 8);
  local_70._0_8_ = &PTR__ScriptWitness_00735628;
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            (this_00,&pCVar3[uVar4].pegin_witness_.witness_stack_);
  if ((pointer)local_50._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_50._0_8_);
  }
  __return_storage_ptr__->_vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_00735628;
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            (&__return_storage_ptr__->witness_stack_,this_00);
  local_70._0_8_ = &PTR__ScriptWitness_00735628;
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(this_00);
  return __return_storage_ptr__;
}

Assistant:

const ScriptWitness ConfidentialTransaction::SetPeginWitnessStack(
    uint32_t tx_in_index, uint32_t witness_index,
    const std::vector<uint8_t> &data) {
  CheckTxInIndex(tx_in_index, __LINE__, __FUNCTION__);

  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  if (tx_pointer->num_inputs > tx_in_index) {
    int ret = WALLY_EINVAL;
    struct wally_tx_witness_stack *stack_pointer = NULL;

    std::string function_name = "wally witness is NULL.";
    if (tx_pointer->inputs[tx_in_index].pegin_witness != NULL) {
      stack_pointer = tx_pointer->inputs[tx_in_index].pegin_witness;

      // append witness stack
      function_name = "wally_tx_witness_stack_set";
      if (data.empty()) {
        ret =
            wally_tx_witness_stack_set(stack_pointer, witness_index, NULL, 0);
      } else {
        ret = wally_tx_witness_stack_set(
            stack_pointer, witness_index, data.data(), data.size());
      }
    }

    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "{} NG[{}].", function_name, ret);
      throw CfdException(kCfdIllegalStateError, "witness stack set error.");
    }
  }
  SetElementsTxState();

  const ScriptWitness &witness =
      vin_[tx_in_index].SetPeginWitnessStack(witness_index, ByteData(data));
  return witness;
}